

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O0

void __thiscall spv::Builder::postProcessFeatures(Builder *this)

{
  anon_class_16_2_59b612c5 __f;
  int iVar1;
  bool bVar2;
  uint uVar3;
  Id IVar4;
  int iVar5;
  Op OVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  reference ppIVar9;
  vector<spv::Function_*,_std::allocator<spv::Function_*>_> *pvVar10;
  reference ppFVar11;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> *pvVar12;
  reference ppBVar13;
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  *pvVar14;
  pointer puVar15;
  pointer pIVar16;
  Instruction *pIVar17;
  reference pvVar18;
  ulong local_150;
  size_t i_1;
  Instruction *instr;
  Id id;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> workgroup_variables;
  value_type *ep;
  key_type local_10c;
  _Self local_108;
  _Self local_100;
  key_type local_f4;
  _Self local_f0;
  Function **local_e8;
  Block **local_e0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *local_d8;
  anon_class_16_2_59b612c5 local_d0;
  Id *local_c0;
  Id *local_b8;
  _Base_ptr local_b0;
  _Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
  local_a8;
  Id *local_a0;
  anon_class_16_2_59b612c5 function;
  bool foundDecoration;
  Id resultId;
  Instruction *inst;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_78;
  const_iterator vi;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_68;
  __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
  local_60;
  const_iterator ii;
  Block *b;
  __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
  local_48;
  const_iterator bi;
  Function *f;
  __normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
  local_30;
  const_iterator fi;
  Instruction *type;
  Builder *pBStack_10;
  int t;
  Builder *this_local;
  
  type._4_4_ = 0;
  pBStack_10 = this;
  do {
    iVar1 = type._4_4_;
    type._0_4_ = 0x20;
    pmVar7 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,(key_type *)&type);
    sVar8 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar7);
    if ((int)sVar8 <= iVar1) {
      pvVar10 = Module::getFunctions(&this->module);
      local_30._M_current =
           (Function **)
           std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>::cbegin(pvVar10);
      while( true ) {
        pvVar10 = Module::getFunctions(&this->module);
        f = (Function *)
            std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>::cend(pvVar10);
        bVar2 = __gnu_cxx::operator!=
                          (&local_30,
                           (__normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
                            *)&f);
        if (!bVar2) break;
        ppFVar11 = __gnu_cxx::
                   __normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
                   ::operator*(&local_30);
        bi._M_current = (Block **)*ppFVar11;
        pvVar12 = spv::Function::getBlocks((Function *)bi._M_current);
        local_48._M_current =
             (Block **)std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::cbegin(pvVar12);
        while( true ) {
          pvVar12 = spv::Function::getBlocks((Function *)bi._M_current);
          b = (Block *)std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>::cend(pvVar12);
          bVar2 = __gnu_cxx::operator!=
                            (&local_48,
                             (__normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                              *)&b);
          if (!bVar2) break;
          ppBVar13 = __gnu_cxx::
                     __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                     ::operator*(&local_48);
          ii._M_current =
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)*ppBVar13;
          pvVar14 = Block::getInstructions((Block *)ii._M_current);
          local_60._M_current =
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               std::
               vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ::cbegin(pvVar14);
          while( true ) {
            pvVar14 = Block::getInstructions((Block *)ii._M_current);
            local_68._M_current =
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 std::
                 vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ::cend(pvVar14);
            bVar2 = __gnu_cxx::operator!=(&local_60,&local_68);
            if (!bVar2) break;
            puVar15 = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                      ::operator->(&local_60);
            pIVar16 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::get
                                (puVar15);
            postProcess(this,pIVar16);
            vi._M_current =
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                 ::operator++(&local_60,0);
          }
          pvVar14 = Block::getLocalVariables((Block *)ii._M_current);
          local_78._M_current =
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               std::
               vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ::cbegin(pvVar14);
          while( true ) {
            pvVar14 = Block::getLocalVariables((Block *)ii._M_current);
            inst = (Instruction *)
                   std::
                   vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                   ::cend(pvVar14);
            bVar2 = __gnu_cxx::operator!=
                              (&local_78,
                               (__normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                                *)&inst);
            if (!bVar2) break;
            puVar15 = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                      ::operator->(&local_78);
            pIVar16 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::get
                                (puVar15);
            function.foundDecoration._4_4_ = spv::Instruction::getResultId(pIVar16);
            IVar4 = getDerefTypeId(this,function.foundDecoration._4_4_);
            bVar2 = containsPhysicalStorageBufferOrArray(this,IVar4);
            if (bVar2) {
              function.foundDecoration._3_1_ = 0;
              local_a0 = (Id *)((long)&function.foundDecoration + 4);
              function.resultId = (Id *)((long)&function.foundDecoration + 3);
              local_a8._M_node =
                   (_Base_ptr)
                   std::
                   set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                   ::begin(&this->decorations);
              local_b0 = (_Base_ptr)
                         std::
                         set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         ::end(&this->decorations);
              local_c0 = local_a0;
              local_b8 = function.resultId;
              __f.foundDecoration = (bool *)function.resultId;
              __f.resultId = local_a0;
              local_d0 = std::
                         for_each<std::_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::postProcessFeatures()::__0>
                                   (local_a8,(_Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
                                              )local_b0,__f);
              if ((function.foundDecoration._3_1_ & 1) == 0) {
                addDecoration(this,function.foundDecoration._4_4_,AliasedPointer,-1);
              }
            }
            local_d8 = (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                       __gnu_cxx::
                       __normal_iterator<const_std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_*,_std::vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>_>
                       ::operator++(&local_78,0);
          }
          local_e0 = (Block **)
                     __gnu_cxx::
                     __normal_iterator<spv::Block_*const_*,_std::vector<spv::Block_*,_std::allocator<spv::Block_*>_>_>
                     ::operator++(&local_48,0);
        }
        local_e8 = (Function **)
                   __gnu_cxx::
                   __normal_iterator<spv::Function_*const_*,_std::vector<spv::Function_*,_std::allocator<spv::Function_*>_>_>
                   ::operator++(&local_30,0);
      }
      local_f4 = CapabilityVulkanMemoryModel;
      local_f0._M_node =
           (_Base_ptr)
           std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::
           find(&this->capabilities,&local_f4);
      local_100._M_node =
           (_Base_ptr)
           std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::
           end(&this->capabilities);
      bVar2 = std::operator!=(&local_f0,&local_100);
      if (bVar2) {
        this->memoryModel = MemoryModelVulkan;
        addIncorporatedExtension(this,"SPV_KHR_vulkan_memory_model",Spv_1_5);
      }
      local_10c = CapabilityWorkgroupMemoryExplicitLayoutKHR;
      local_108._M_node =
           (_Base_ptr)
           std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::
           find(&this->capabilities,&local_10c);
      ep = (value_type *)
           std::set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>::
           end(&this->capabilities);
      bVar2 = std::operator!=(&local_108,(_Self *)&ep);
      if (bVar2) {
        sVar8 = std::
                vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ::size(&this->entryPoints);
        if (sVar8 != 1) {
          __assert_fail("entryPoints.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                        ,0x1d0,"void spv::Builder::postProcessFeatures()");
        }
        workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                      ::operator[](&this->entryPoints,0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&id);
        instr._4_4_ = 0;
        while( true ) {
          iVar1 = instr._4_4_;
          pIVar16 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                    operator->((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                *)workgroup_variables.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar5 = spv::Instruction::getNumOperands(pIVar16);
          if (iVar5 <= iVar1) break;
          pIVar16 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                    operator->((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                *)workgroup_variables.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = spv::Instruction::isIdOperand(pIVar16,instr._4_4_);
          if (bVar2) {
            pIVar16 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                      operator->((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                  *)workgroup_variables.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
            instr._0_4_ = spv::Instruction::getIdOperand(pIVar16,instr._4_4_);
            pIVar17 = Module::getInstruction(&this->module,(Id)instr);
            OVar6 = spv::Instruction::getOpCode(pIVar17);
            if ((OVar6 == OpVariable) &&
               (uVar3 = spv::Instruction::getImmediateOperand(pIVar17,0), uVar3 == 4)) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&id,
                         (value_type_conflict *)&instr);
            }
          }
          instr._4_4_ = instr._4_4_ + 1;
        }
        sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&id);
        if (1 < sVar8) {
          for (local_150 = 0;
              sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&id),
              local_150 < sVar8; local_150 = local_150 + 1) {
            pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&id,
                                 local_150);
            addDecoration(this,*pvVar18,Aliased,-1);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&id);
      }
      return;
    }
    fi._M_current._4_4_ = 0x20;
    pmVar7 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,(key_type *)((long)&fi._M_current + 4));
    ppIVar9 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar7,(long)type._4_4_);
    pIVar17 = *ppIVar9;
    uVar3 = spv::Instruction::getImmediateOperand(pIVar17,0);
    if (uVar3 == 0x14e5) {
      IVar4 = spv::Instruction::getIdOperand(pIVar17,1);
      bVar2 = containsType(this,IVar4,OpTypeInt,8);
      if (bVar2) {
        addIncorporatedExtension(this,"SPV_KHR_8bit_storage",Spv_1_5);
        addCapability(this,CapabilityStorageBuffer8BitAccess);
      }
      IVar4 = spv::Instruction::getIdOperand(pIVar17,1);
      bVar2 = containsType(this,IVar4,OpTypeInt,0x10);
      if (!bVar2) {
        IVar4 = spv::Instruction::getIdOperand(pIVar17,1);
        bVar2 = containsType(this,IVar4,OpTypeFloat,0x10);
        if (!bVar2) goto LAB_006ef5ee;
      }
      addIncorporatedExtension(this,"SPV_KHR_16bit_storage",Spv_1_3);
      addCapability(this,CapabilityStorageBuffer16BitAccess);
    }
LAB_006ef5ee:
    type._4_4_ = type._4_4_ + 1;
  } while( true );
}

Assistant:

void Builder::postProcessFeatures() {
    // Add per-instruction capabilities, extensions, etc.,

    // Look for any 8/16 bit type in physical storage buffer class, and set the
    // appropriate capability. This happens in createSpvVariable for other storage
    // classes, but there isn't always a variable for physical storage buffer.
    for (int t = 0; t < (int)groupedTypes[OpTypePointer].size(); ++t) {
        Instruction* type = groupedTypes[OpTypePointer][t];
        if (type->getImmediateOperand(0) == (unsigned)StorageClassPhysicalStorageBufferEXT) {
            if (containsType(type->getIdOperand(1), OpTypeInt, 8)) {
                addIncorporatedExtension(spv::E_SPV_KHR_8bit_storage, spv::Spv_1_5);
                addCapability(spv::CapabilityStorageBuffer8BitAccess);
            }
            if (containsType(type->getIdOperand(1), OpTypeInt, 16) ||
                containsType(type->getIdOperand(1), OpTypeFloat, 16)) {
                addIncorporatedExtension(spv::E_SPV_KHR_16bit_storage, spv::Spv_1_3);
                addCapability(spv::CapabilityStorageBuffer16BitAccess);
            }
        }
    }

    // process all block-contained instructions
    for (auto fi = module.getFunctions().cbegin(); fi != module.getFunctions().cend(); fi++) {
        Function* f = *fi;
        for (auto bi = f->getBlocks().cbegin(); bi != f->getBlocks().cend(); bi++) {
            Block* b = *bi;
            for (auto ii = b->getInstructions().cbegin(); ii != b->getInstructions().cend(); ii++)
                postProcess(*ii->get());

            // For all local variables that contain pointers to PhysicalStorageBufferEXT, check whether
            // there is an existing restrict/aliased decoration. If we don't find one, add Aliased as the
            // default.
            for (auto vi = b->getLocalVariables().cbegin(); vi != b->getLocalVariables().cend(); vi++) {
                const Instruction& inst = *vi->get();
                Id resultId = inst.getResultId();
                if (containsPhysicalStorageBufferOrArray(getDerefTypeId(resultId))) {
                    bool foundDecoration = false;
                    const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                        if (decoration.get()->getIdOperand(0) == resultId &&
                            decoration.get()->getOpCode() == OpDecorate &&
                            (decoration.get()->getImmediateOperand(1) == spv::DecorationAliasedPointerEXT ||
                             decoration.get()->getImmediateOperand(1) == spv::DecorationRestrictPointerEXT)) {
                            foundDecoration = true;
                        }
                    };
                    std::for_each(decorations.begin(), decorations.end(), function);
                    if (!foundDecoration) {
                        addDecoration(resultId, spv::DecorationAliasedPointerEXT);
                    }
                }
            }
        }
    }

    // If any Vulkan memory model-specific functionality is used, update the
    // OpMemoryModel to match.
    if (capabilities.find(spv::CapabilityVulkanMemoryModelKHR) != capabilities.end()) {
        memoryModel = spv::MemoryModelVulkanKHR;
        addIncorporatedExtension(spv::E_SPV_KHR_vulkan_memory_model, spv::Spv_1_5);
    }

    // Add Aliased decoration if there's more than one Workgroup Block variable.
    if (capabilities.find(spv::CapabilityWorkgroupMemoryExplicitLayoutKHR) != capabilities.end()) {
        assert(entryPoints.size() == 1);
        auto &ep = entryPoints[0];

        std::vector<Id> workgroup_variables;
        for (int i = 0; i < (int)ep->getNumOperands(); i++) {
            if (!ep->isIdOperand(i))
                continue;

            const Id id = ep->getIdOperand(i);
            const Instruction *instr = module.getInstruction(id);
            if (instr->getOpCode() != spv::OpVariable)
                continue;

            if (instr->getImmediateOperand(0) == spv::StorageClassWorkgroup)
                workgroup_variables.push_back(id);
        }

        if (workgroup_variables.size() > 1) {
            for (size_t i = 0; i < workgroup_variables.size(); i++)
                addDecoration(workgroup_variables[i], spv::DecorationAliased);
        }
    }
}